

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HwlocCpuInfo.cpp
# Opt level: O1

bool __thiscall xmrig::HwlocCpuInfo::membind(HwlocCpuInfo *this,hwloc_const_bitmap_t nodeset)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = hwloc_topology_get_support(this->m_topology);
  if (*(char *)(*(long *)(lVar2 + 0x10) + 4) == '\0') {
    bVar3 = false;
  }
  else {
    iVar1 = hwloc_set_membind(this->m_topology,nodeset,2,0x22);
    bVar3 = -1 < iVar1;
  }
  return bVar3;
}

Assistant:

bool xmrig::HwlocCpuInfo::membind(hwloc_const_bitmap_t nodeset)
{
    if (!hwloc_topology_get_support(m_topology)->membind->set_thisthread_membind) {
        return false;
    }

#   if HWLOC_API_VERSION >= 0x20000
    return hwloc_set_membind(m_topology, nodeset, HWLOC_MEMBIND_BIND, HWLOC_MEMBIND_THREAD | HWLOC_MEMBIND_BYNODESET) >= 0;
#   else
    return hwloc_set_membind_nodeset(m_topology, nodeset, HWLOC_MEMBIND_BIND, HWLOC_MEMBIND_THREAD) >= 0;
#   endif
}